

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.h
# Opt level: O0

void __thiscall jaegertracing::net::IPAddress::print(IPAddress *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined1 local_38 [8];
  string addrStr;
  ostream *out_local;
  IPAddress *this_local;
  
  addrStr.field_2._8_8_ = out;
  poVar2 = std::operator<<(out,"{ family=");
  iVar1 = family(this);
  std::ostream::operator<<(poVar2,iVar1);
  host_abi_cxx11_((string *)local_38,this);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)addrStr.field_2._8_8_,", addr=");
    std::operator<<(poVar2,(string *)local_38);
  }
  poVar2 = std::operator<<((ostream *)addrStr.field_2._8_8_,", port=");
  iVar1 = port(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2," }");
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void print(std::ostream& out) const
    {
        out << "{ family=" << family();
        const auto addrStr = host();
        if (!addrStr.empty()) {
            out << ", addr=" << addrStr;
        }
        out << ", port=" << port() << " }";
    }